

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O1

bool __thiscall QWidgetLineControl::fixup(QWidgetLineControl *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  long in_FS_OFFSET;
  QStringView QVar4;
  QStringView QVar5;
  int cursorCopy;
  int local_4c;
  QString local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(long *)(this + 0xa8) != 0) && (*(int *)(*(long *)(this + 0xa8) + 4) != 0)) &&
     (*(long *)(this + 0xb0) != 0)) {
    local_48.d.d = *(Data **)(this + 0x18);
    local_48.d.ptr = *(char16_t **)(this + 0x20);
    local_48.d.size = *(qsizetype *)(this + 0x28);
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_4c = *(int *)(this + 0x40);
    (**(code **)(**(long **)(this + 0xb0) + 0x68))(*(long **)(this + 0xb0),&local_48);
    iVar3 = (**(code **)(**(long **)(this + 0xb0) + 0x60))
                      (*(long **)(this + 0xb0),&local_48,&local_4c);
    if (iVar3 == 2) {
      if (local_48.d.size == *(long *)(this + 0x28)) {
        QVar4.m_data = local_48.d.ptr;
        QVar4.m_size = local_48.d.size;
        QVar5.m_data = *(storage_type_conflict **)(this + 0x20);
        QVar5.m_size = *(long *)(this + 0x28);
        cVar1 = QtPrivate::equalStrings(QVar4,QVar5);
        if ((cVar1 != '\0') && (local_4c == *(int *)(this + 0x40))) goto LAB_0042bd5c;
      }
      internalSetText(this,&local_48,local_4c,false);
    }
LAB_0042bd5c:
    if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
      }
    }
    bVar2 = true;
    if (iVar3 == 2) goto LAB_0042bd88;
  }
  bVar2 = false;
LAB_0042bd88:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QWidgetLineControl::fixup() // this function assumes that validate currently returns != Acceptable
{
#ifndef QT_NO_VALIDATOR
    if (m_validator) {
        QString textCopy = m_text;
        int cursorCopy = m_cursor;
        m_validator->fixup(textCopy);
        if (m_validator->validate(textCopy, cursorCopy) == QValidator::Acceptable) {
            if (textCopy != m_text || cursorCopy != m_cursor)
                internalSetText(textCopy, cursorCopy, false);
            return true;
        }
    }
#endif
    return false;
}